

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

void __thiscall
ocl::OpenCLKernelArg::OpenCLKernelArg(OpenCLKernelArg *this,shared_device_buffer *arg)

{
  cl_mem p_Var1;
  size_t sVar2;
  undefined **local_20 [2];
  
  this->is_null = false;
  this->size = 8;
  p_Var1 = gpu::shared_device_buffer::clmem(arg);
  this->cl_mem_storage = p_Var1;
  this->value = &this->cl_mem_storage;
  sVar2 = gpu::shared_device_buffer::cloffset(arg);
  if (sVar2 != 0) {
    std::runtime_error::runtime_error((runtime_error *)local_20,"Offset is not zero, but ignored!");
    local_20[0] = &PTR__runtime_error_0013cc28;
    std::runtime_error::~runtime_error((runtime_error *)local_20);
  }
  return;
}

Assistant:

OpenCLKernelArg::OpenCLKernelArg(const gpu::shared_device_buffer &arg)
{
	is_null = false;
	size = sizeof(cl_mem);
	cl_mem_storage = arg.clmem();
	value = &cl_mem_storage;
	if (arg.cloffset() != 0) {
		ocl_exception("Offset is not zero, but ignored!");
	}
}